

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc3::applyPoint
          (Interval *__return_storage_ptr__,FloatFunc3 *this,EvalContext *ctx,double x,double y,
          double z)

{
  Interval local_a0;
  Interval local_88;
  Interval local_70;
  Interval local_58;
  double local_40;
  double prec;
  double exact;
  double z_local;
  double y_local;
  double x_local;
  EvalContext *ctx_local;
  FloatFunc3 *this_local;
  
  exact = z;
  z_local = y;
  y_local = x;
  x_local = (double)ctx;
  ctx_local = (EvalContext *)this;
  prec = (double)(**(code **)(*(long *)this + 0x60))(x,y,z);
  local_40 = (double)(**(code **)(*(long *)this + 0x68))(prec,y_local,z_local,exact,this,x_local);
  tcu::Interval::Interval(&local_58,prec);
  tcu::Interval::Interval(&local_88,-local_40);
  tcu::Interval::Interval(&local_a0,local_40);
  tcu::Interval::Interval(&local_70,&local_88,&local_a0);
  tcu::operator+(__return_storage_ptr__,&local_58,&local_70);
  return __return_storage_ptr__;
}

Assistant:

virtual Interval	applyPoint		(const EvalContext&	ctx,
										 double				x,
										 double				y,
										 double				z) const
	{
		const double exact	= this->applyExact(x, y, z);
		const double prec	= this->precision(ctx, exact, x, y, z);
		return exact + Interval(-prec, prec);
	}